

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O2

int jpc_floorlog2(int x)

{
  int iVar1;
  
  if (0 < x) {
    iVar1 = 0;
    for (; 1 < (uint)x; x = (uint)x >> 1) {
      iVar1 = iVar1 + 1;
    }
    return iVar1;
  }
  __assert_fail("x > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x59,"int jpc_floorlog2(int)");
}

Assistant:

int jpc_floorlog2(int x)
{
	int y;

	/* The argument must be positive. */
	assert(x > 0);

	y = 0;
	while (x > 1) {
		x >>= 1;
		++y;
	}
	return y;
}